

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::BinaryAggregateHeap<double,_duckdb::string_t,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<double,_duckdb::string_t,_duckdb::LessThan> *this,
          ArenaAllocator *allocator,double *key,string_t *value)

{
  undefined4 uVar1;
  bool bVar2;
  char (**ppacVar3) [4];
  idx_t iVar4;
  HeapEntry<duckdb::string_t> *other;
  STORAGE_TYPE *pSVar5;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  __cmp;
  undefined1 local_98 [24];
  uint32_t local_80;
  char (*local_78) [4];
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  local_70;
  STORAGE_TYPE *local_68;
  STORAGE_TYPE *local_60;
  double local_58;
  anon_union_16_2_67f50693_for_value local_50;
  uint32_t local_40;
  char (*local_38) [4];
  
  if (this->size < this->capacity) {
    pSVar5 = this->heap + this->size;
    (pSVar5->first).value = *key;
    HeapEntry<duckdb::string_t>::Assign(&pSVar5->second,allocator,value);
    pSVar5 = this->heap;
    iVar4 = this->size;
    this->size = iVar4 + 1;
    local_70._M_comp = Compare;
    local_58 = *(double *)((long)(&pSVar5[iVar4].second + -1) + 0x18);
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_50.pointer,&pSVar5[iVar4].second);
    local_98._0_8_ = local_58;
    if ((uint)local_50._0_4_ < 0xd) {
      local_98._16_8_ = local_50.pointer.ptr;
      local_80 = 0;
      ppacVar3 = &local_78;
    }
    else {
      ppacVar3 = &local_38;
      local_80 = local_40;
      local_78 = local_38;
      local_50.pointer.prefix = *local_38;
      local_98._16_8_ = local_38;
    }
    local_98[0xc] = local_50.pointer.prefix[0];
    local_98[0xd] = local_50.pointer.prefix[1];
    local_98[0xe] = local_50.pointer.prefix[2];
    local_98[0xf] = local_50.pointer.prefix[3];
    local_98._8_4_ = local_50.pointer.length;
    *ppacVar3 = (char (*) [4])0x0;
  }
  else {
    bVar2 = GreaterThan::Operation<double>((double *)this->heap,key);
    if (!bVar2) {
      return;
    }
    iVar4 = this->size;
    if (1 < (long)iVar4) {
      pSVar5 = this->heap;
      local_68 = pSVar5 + (iVar4 - 1);
      local_58 = (local_68->first).value;
      other = &pSVar5[iVar4 - 1].second;
      HeapEntry<duckdb::string_t>::HeapEntry((HeapEntry<duckdb::string_t> *)&local_50.pointer,other)
      ;
      *(double *)((long)(other + -1) + 0x18) = (pSVar5->first).value;
      local_60 = pSVar5;
      HeapEntry<duckdb::string_t>::operator=(other,&pSVar5->second);
      local_98._0_8_ = local_58;
      if ((uint)local_50._0_4_ < 0xd) {
        local_98._16_8_ = local_50.pointer.ptr;
        local_80 = 0;
        ppacVar3 = &local_78;
        uVar1 = local_50.pointer.prefix;
      }
      else {
        ppacVar3 = &local_38;
        local_80 = local_40;
        local_78 = local_38;
        uVar1 = *local_38;
        local_98._16_8_ = local_38;
      }
      local_98[0xc] = (char)uVar1;
      local_98[0xd] = SUB41(uVar1,1);
      local_98[0xe] = SUB41(uVar1,2);
      local_98[0xf] = SUB41(uVar1,3);
      local_98._8_4_ = local_50.pointer.length;
      *ppacVar3 = (char (*) [4])0x0;
      ::std::
      __adjust_heap<std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>*,long,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
                (local_60,0,((long)local_68 - (long)local_60 >> 3) * -0x3333333333333333,
                 (pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_> *)local_98,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
                  )0xd76f44);
    }
    pSVar5 = this->heap;
    iVar4 = this->size;
    pSVar5[iVar4 - 1].first.value = *key;
    HeapEntry<duckdb::string_t>::Assign(&pSVar5[iVar4 - 1].second,allocator,value);
    pSVar5 = this->heap;
    iVar4 = this->size;
    local_70._M_comp = Compare;
    local_58 = *(double *)((long)(&pSVar5[iVar4 - 1].second + -1) + 0x18);
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_50.pointer,&pSVar5[iVar4 - 1].second);
    local_98._0_8_ = local_58;
    if ((uint)local_50._0_4_ < 0xd) {
      local_98._16_8_ = local_50.pointer.ptr;
      local_80 = 0;
      ppacVar3 = &local_78;
    }
    else {
      ppacVar3 = &local_38;
      local_80 = local_40;
      local_78 = local_38;
      local_50.pointer.prefix = *local_38;
      local_98._16_8_ = local_38;
    }
    local_98[0xc] = local_50.pointer.prefix[0];
    local_98[0xd] = local_50.pointer.prefix[1];
    local_98[0xe] = local_50.pointer.prefix[2];
    local_98[0xf] = local_50.pointer.prefix[3];
    local_98._8_4_ = local_50.pointer.length;
    *ppacVar3 = (char (*) [4])0x0;
    iVar4 = iVar4 - 1;
  }
  ::std::
  __push_heap<std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>*,long,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
            (pSVar5,iVar4,0,
             (pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_> *)local_98,
             &local_70);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}